

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O2

void __thiscall slack::_detail::Slacking::~Slacking(Slacking *this)

{
  CategoryWebHook::~CategoryWebHook(&this->hook);
  CategoryChat::~CategoryChat(&this->chat);
  std::__cxx11::string::~string((string *)&this->token_);
  Session::~Session(&this->session_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Slacking() = delete;